

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O2

bool remove_handler(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
                   ValueCallback *callback)

{
  _Elt_pointer ppVVar1;
  int __n;
  _Map_pointer pppVVar2;
  _Elt_pointer ppVVar3;
  _Elt_pointer ppVVar4;
  iterator it;
  const_iterator local_88;
  _Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**> local_68;
  iterator local_40;
  
  local_68._M_cur =
       (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_68._M_last =
       (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_68._M_node =
       (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  ppVVar1 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  __n = 0;
  pppVVar2 = local_68._M_node;
  ppVVar3 = local_68._M_last;
  ppVVar4 = local_68._M_cur;
  do {
    if (ppVVar4 == ppVVar1) {
LAB_0010b6d0:
      return ppVVar4 != ppVVar1;
    }
    if (*ppVVar4 == callback) {
      local_68._M_first =
           (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>)._M_impl
           .super__Deque_impl_data._M_start._M_first;
      std::advance<std::_Deque_iterator<ValueCallback*,ValueCallback*&,ValueCallback**>,int>
                (&local_68,__n);
      local_88._M_cur = local_68._M_cur;
      local_88._M_first = local_68._M_first;
      local_88._M_last = local_68._M_last;
      local_88._M_node = local_68._M_node;
      std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::erase
                (&local_40,callbacks,&local_88);
      goto LAB_0010b6d0;
    }
    __n = __n + 1;
    ppVVar4 = ppVVar4 + 1;
    if (ppVVar4 == ppVVar3) {
      ppVVar4 = pppVVar2[1];
      pppVVar2 = pppVVar2 + 1;
      ppVVar3 = ppVVar4 + 0x40;
    }
  } while( true );
}

Assistant:

bool remove_handler(std::deque<ValueCallback*>& callbacks, ValueCallback* callback){
    int i = 0;
    int found = -1;
    for(auto cb : callbacks){
        if(cb == callback){
            found = i;
            break;
        }
        i++;
    }

    if(found > -1){
        auto it = callbacks.begin();
        std::advance(it, found);
        callbacks.erase(it);
        return true;
    } else {
        return false;
    }
}